

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu2.c
# Opt level: O2

MPP_RET vdpu2_mpg4d_init(void *hal,MppHalCfg *cfg)

{
  MppBufSlots pvVar1;
  MPP_RET MVar2;
  void *ptr;
  char *fmt;
  ulong uVar3;
  MppBufferGroup local_38;
  MppBuffer qp_table;
  MppBuffer mv_buf;
  
  local_38 = (MppBufferGroup)0x0;
  mv_buf = (MppBuffer)0x0;
  qp_table = (MppBuffer)0x0;
  if ((hal == (void *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
                 "vdpu2_mpg4d_init",0xe8), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  MVar2 = mpp_buffer_group_get
                    (&local_38,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_m4vd_vdpu2",
                     "vdpu2_mpg4d_init");
  if (MVar2 == MPP_OK) {
    MVar2 = mpp_buffer_get_with_tag(local_38,&mv_buf,0x1fe00,"hal_m4vd_vdpu2","vdpu2_mpg4d_init");
    if (MVar2 == MPP_OK) {
      MVar2 = mpp_buffer_get_with_tag(local_38,&qp_table,0x80,"hal_m4vd_vdpu2","vdpu2_mpg4d_init");
      if (MVar2 == MPP_OK) {
        ptr = mpp_osal_calloc("vdpu2_mpg4d_init",0x27c);
        if (ptr == (void *)0x0) {
          _mpp_log_l(2,"hal_m4vd_vdpu2","failed to malloc register ret\n","vdpu2_mpg4d_init");
          MVar2 = MPP_ERR_MALLOC;
        }
        else {
          MVar2 = mpp_dev_init((MppDev *)((long)hal + 0x20),VPU_CLIENT_VDPU2);
          if (MVar2 == MPP_OK) {
            pvVar1 = cfg->packet_slots;
            *(MppBufSlots *)hal = cfg->frame_slots;
            *(MppBufSlots *)((long)hal + 8) = pvVar1;
            *(MppCbCtx **)((long)hal + 0x18) = cfg->dec_cb;
            *(MppBufferGroup *)((long)hal + 0x10) = local_38;
            *(MppBuffer *)((long)hal + 0x38) = mv_buf;
            *(MppBuffer *)((long)hal + 0x40) = qp_table;
            *(void **)((long)hal + 0x48) = ptr;
            cfg->dev = *(MppDev *)((long)hal + 0x20);
            mpp_env_get_u32("hal_mpg4d_debug",&hal_mpg4d_debug,0);
            return MPP_OK;
          }
          _mpp_log_l(2,"hal_m4vd_vdpu2","mpp_dev_init failed. ret: %d\n","vdpu2_mpg4d_init",
                     (ulong)(uint)MVar2);
          mpp_osal_free("vdpu2_mpg4d_init",ptr);
        }
        goto LAB_001f2c3d;
      }
      uVar3 = (ulong)(uint)MVar2;
      fmt = "failed to get qp talbe buffer ret %d\n";
    }
    else {
      uVar3 = (ulong)(uint)MVar2;
      fmt = "failed to get mv buffer ret %d\n";
    }
  }
  else {
    uVar3 = (ulong)(uint)MVar2;
    fmt = "failed to get buffer group ret %d\n";
  }
  MVar2 = (MPP_RET)uVar3;
  _mpp_log_l(2,"hal_m4vd_vdpu2",fmt,"vdpu2_mpg4d_init",uVar3);
LAB_001f2c3d:
  if (qp_table != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(qp_table,"vdpu2_mpg4d_init");
    qp_table = (MppBuffer)0x0;
  }
  if (mv_buf != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(mv_buf,"vdpu2_mpg4d_init");
    mv_buf = (MppBuffer)0x0;
  }
  if (local_38 != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(local_38);
  }
  return MVar2;
}

Assistant:

MPP_RET vdpu2_mpg4d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    M4vdVdpu2Regs_t *regs = NULL;
    MppBufferGroup group = NULL;
    MppBuffer mv_buf = NULL;
    MppBuffer qp_table = NULL;
    hal_mpg4_ctx *ctx = (hal_mpg4_ctx *)hal;

    mpp_assert(hal);

    ret = mpp_buffer_group_get_internal(&group, MPP_BUFFER_TYPE_ION);
    if (ret) {
        mpp_err_f("failed to get buffer group ret %d\n", ret);
        goto ERR_RET;
    }

    ret = mpp_buffer_get(group, &mv_buf, MPEG4_MAX_MV_BUF_SIZE);
    if (ret) {
        mpp_err_f("failed to get mv buffer ret %d\n", ret);
        goto ERR_RET;
    }

    ret = mpp_buffer_get(group, &qp_table, 64 * 2 * sizeof(RK_U8));
    if (ret) {
        mpp_err_f("failed to get qp talbe buffer ret %d\n", ret);
        goto ERR_RET;
    }

    regs = mpp_calloc(M4vdVdpu2Regs_t, 1);
    if (NULL == regs) {
        mpp_err_f("failed to malloc register ret\n");
        ret = MPP_ERR_MALLOC;
        goto ERR_RET;
    }

    ret = mpp_dev_init(&ctx->dev, VPU_CLIENT_VDPU2);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto ERR_RET;
    }

    ctx->frm_slots  = cfg->frame_slots;
    ctx->pkt_slots  = cfg->packet_slots;
    ctx->dec_cb     = cfg->dec_cb;
    ctx->group      = group;
    ctx->mv_buf     = mv_buf;
    ctx->qp_table   = qp_table;
    ctx->regs       = regs;
    cfg->dev        = ctx->dev;

    mpp_env_get_u32("hal_mpg4d_debug", &hal_mpg4d_debug, 0);

    return ret;
ERR_RET:
    if (regs) {
        mpp_free(regs);
        regs = NULL;
    }

    if (qp_table) {
        mpp_buffer_put(qp_table);
        qp_table = NULL;
    }

    if (mv_buf) {
        mpp_buffer_put(mv_buf);
        mv_buf = NULL;
    }

    if (group) {
        mpp_buffer_group_put(group);
        group = NULL;
    }

    return ret;
}